

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::reserve(Buffer *this,off_t minSize)

{
  long local_20;
  off_t newSize;
  off_t minSize_local;
  Buffer *this_local;
  
  if (this->capacity_ <= minSize) {
    local_20 = this->capacity_;
    do {
      local_20 = local_20 << 1;
    } while (local_20 < minSize);
    resize(this,local_20);
  }
  return;
}

Assistant:

void Buffer::reserve(off_t minSize) {
    if (minSize < capacity_)
        return;
    off_t newSize = capacity_ << 1;
    while (newSize < minSize)
        newSize = newSize << 1;
    resize(newSize);
}